

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ptls_openssl_signature_scheme_t *
ptls_openssl_select_signature_scheme
          (ptls_openssl_signature_scheme_t *available,uint16_t *algorithms,size_t num_algorithms)

{
  size_t local_38;
  size_t i;
  ptls_openssl_signature_scheme_t *scheme;
  size_t num_algorithms_local;
  uint16_t *algorithms_local;
  ptls_openssl_signature_scheme_t *available_local;
  
  i = (size_t)available;
  do {
    if (*(short *)i == -1) {
      return (ptls_openssl_signature_scheme_t *)0x0;
    }
    for (local_38 = 0; local_38 != num_algorithms; local_38 = local_38 + 1) {
      if (algorithms[local_38] == *(uint16_t *)i) {
        return (ptls_openssl_signature_scheme_t *)i;
      }
    }
    i = i + 0x10;
  } while( true );
}

Assistant:

const ptls_openssl_signature_scheme_t *ptls_openssl_select_signature_scheme(const ptls_openssl_signature_scheme_t *available,
                                                                            const uint16_t *algorithms, size_t num_algorithms)
{
    const ptls_openssl_signature_scheme_t *scheme;

    /* select the algorithm, driven by server-isde preference of `available` */
    for (scheme = available; scheme->scheme_id != UINT16_MAX; ++scheme)
        for (size_t i = 0; i != num_algorithms; ++i)
            if (algorithms[i] == scheme->scheme_id)
                return scheme;

    return NULL;
}